

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> __thiscall
pbrt::Tokenizer::CreateFromFile
          (Tokenizer *this,string *filename,
          function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  bool bVar1;
  int iVar2;
  uint __fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *in_R8;
  undefined4 local_108;
  int in_stack_fffffffffffffefc;
  void *ptr;
  size_t len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  stat stat;
  
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108;
  if (LOGGING_LogLevel < 1) {
    in_R8 = filename;
    Log<std::__cxx11::string_const&>
              (Verbose,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
               ,0x79,"Creating Tokenizer for %s",filename);
  }
  bVar1 = std::operator==(filename,"-");
  if (bVar1) {
    stat.st_dev = (__dev_t)&stat.st_nlink;
    stat.st_ino = 0;
    stat.st_nlink._0_1_ = 0;
    while (iVar2 = getchar(), iVar2 != -1) {
      std::__cxx11::string::push_back((char)&stat);
    }
    std::
    make_unique<pbrt::Tokenizer,std::__cxx11::string,std::function<void(char_const*,pbrt::FileLoc_const*)>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&stat);
    std::__cxx11::string::~string((string *)&stat);
  }
  else {
    __fd = open((filename->_M_dataplus)._M_p,0);
    if (__fd == 0xffffffff) {
      LastError();
      ErrorString_abi_cxx11_(in_stack_fffffffffffffefc);
      StringPrintf<std::__cxx11::string_const&,std::__cxx11::string>
                ((string *)&stat,(pbrt *)0x592969,(char *)filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 in_R8);
      std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                (errorCallback,(char *)stat.st_dev,(FileLoc *)0x0);
      std::__cxx11::string::~string((string *)&stat);
    }
    else {
      iVar2 = fstat(__fd,(stat *)&stat);
      if (iVar2 == 0) {
        len = stat.st_size;
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)__fd;
        ptr = mmap((void *)0x0,stat.st_size,1,1,__fd,0);
        iVar2 = close(__fd);
        if (iVar2 == 0) {
          std::
          make_unique<pbrt::Tokenizer,void*&,unsigned_long&,std::__cxx11::string_const&,std::function<void(char_const*,pbrt::FileLoc_const*)>>
                    ((void **)this,(unsigned_long *)&ptr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                     (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)filename);
          return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>
                 )(__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>
                   )this;
        }
        LastError();
        ErrorString_abi_cxx11_(in_stack_fffffffffffffefc);
        StringPrintf<std::__cxx11::string_const&,std::__cxx11::string>
                  ((string *)&local_108,(pbrt *)0x592969,(char *)filename,&local_d8,pbVar3);
        std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                  (errorCallback,(char *)CONCAT44(in_stack_fffffffffffffefc,local_108),
                   (FileLoc *)0x0);
      }
      else {
        LastError();
        ErrorString_abi_cxx11_(in_stack_fffffffffffffefc);
        StringPrintf<std::__cxx11::string_const&,std::__cxx11::string>
                  ((string *)&local_108,(pbrt *)0x592969,(char *)filename,&local_d8,in_R8);
        std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                  (errorCallback,(char *)CONCAT44(in_stack_fffffffffffffefc,local_108),
                   (FileLoc *)0x0);
      }
      std::__cxx11::string::~string((string *)&local_108);
      pbVar3 = &local_d8;
    }
    std::__cxx11::string::~string((string *)pbVar3);
    (this->loc).filename._M_len = 0;
  }
  return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
         (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Tokenizer> Tokenizer::CreateFromFile(
    const std::string &filename,
    std::function<void(const char *, const FileLoc *)> errorCallback) {
    LOG_VERBOSE("Creating Tokenizer for %s", filename);
    if (filename == "-") {
        // Handle stdin by slurping everything into a string.
        std::string str;
        int ch;
        while ((ch = getchar()) != EOF)
            str.push_back((char)ch);
        return std::make_unique<Tokenizer>(std::move(str), std::move(errorCallback));
    }

#ifdef PBRT_HAVE_MMAP
    int fd = open(filename.c_str(), O_RDONLY);
    if (fd == -1) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    struct stat stat;
    if (fstat(fd, &stat) != 0) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    size_t len = stat.st_size;
    void *ptr = mmap(nullptr, len, PROT_READ, MAP_FILE | MAP_SHARED, fd, 0);
    if (close(fd) != 0) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    return std::make_unique<Tokenizer>(ptr, len, filename, std::move(errorCallback));
#elif defined(PBRT_IS_WINDOWS)
    auto errorReportLambda = [&errorCallback, &filename]() -> std::unique_ptr<Tokenizer> {
        LPSTR messageBuffer = nullptr;
        FormatMessageA(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
                           FORMAT_MESSAGE_IGNORE_INSERTS,
                       NULL, ::GetLastError(), MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
                       (LPSTR)&messageBuffer, 0, NULL);

        errorCallback(StringPrintf("%s: %s", filename, messageBuffer).c_str(), nullptr);

        LocalFree(messageBuffer);
        return nullptr;
    };

    HANDLE fileHandle = CreateFileA(filename.c_str(), GENERIC_READ, FILE_SHARE_READ, 0,
                                    OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, 0);
    if (!fileHandle) {
        return errorReportLambda();
    }

    size_t len = GetFileSize(fileHandle, 0);

    HANDLE mapping = CreateFileMapping(fileHandle, 0, PAGE_READONLY, 0, 0, 0);
    CloseHandle(fileHandle);
    if (mapping == 0) {
        return errorReportLambda();
    }

    LPVOID ptr = MapViewOfFile(mapping, FILE_MAP_READ, 0, 0, 0);
    CloseHandle(mapping);
    if (ptr == nullptr) {
        return errorReportLambda();
    }

    std::string str(static_cast<const char *>(ptr), len);

    return std::make_unique<Tokenizer>(ptr, len, filename, std::move(errorCallback));
#else
    FILE *f = fopen(filename.c_str(), "r");
    if (!f) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    std::string str;
    int ch;
    while ((ch = fgetc(f)) != EOF)
        str.push_back(char(ch));
    fclose(f);
    return std::make_unique_ptr<Tokenizer>(std::move(str), std::move(errorCallback));
#endif
}